

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDup(Abc_Ntk_t *pNtk)

{
  Abc_Aig_t *pMan;
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *p1;
  Abc_Obj_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  char *pcVar6;
  bool local_79;
  int local_38;
  int local_34;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    pNtk_local = Abc_NtkStartFrom(pNtk,pNtk->ntkType,pNtk->ntkFunc);
    iVar1 = Abc_NtkIsStrash(pNtk);
    if (iVar1 == 0) {
      for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1
          ) {
        pAVar3 = Abc_NtkObj(pNtk,local_34);
        if ((pAVar3 != (Abc_Obj_t *)0x0) && ((pAVar3->field_6).pTemp == (void *)0x0)) {
          iVar1 = Abc_NtkHasBlackbox(pNtk);
          local_79 = false;
          if (iVar1 != 0) {
            iVar1 = Abc_ObjIsNet(pAVar3);
            local_79 = iVar1 != 0;
          }
          Abc_NtkDupObj(pNtk_local,pAVar3,(uint)local_79);
        }
      }
      for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1
          ) {
        pAVar3 = Abc_NtkObj(pNtk,local_34);
        if (((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsBox(pAVar3), iVar1 == 0)) &&
           (iVar1 = Abc_ObjIsBo(pAVar3), iVar1 == 0)) {
          for (local_38 = 0; iVar1 = Abc_ObjFaninNum(pAVar3), local_38 < iVar1;
              local_38 = local_38 + 1) {
            pAVar4 = Abc_ObjFanin(pAVar3,local_38);
            Abc_ObjAddFanin((pAVar3->field_6).pCopy,(pAVar4->field_6).pCopy);
          }
        }
      }
    }
    else {
      for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1
          ) {
        pAVar3 = Abc_NtkObj(pNtk,local_34);
        if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_AigNodeIsAnd(pAVar3), iVar1 != 0)) {
          pMan = (Abc_Aig_t *)pNtk_local->pManFunc;
          pAVar4 = Abc_ObjChild0Copy(pAVar3);
          p1 = Abc_ObjChild1Copy(pAVar3);
          pAVar4 = Abc_AigAnd(pMan,pAVar4,p1);
          (pAVar3->field_6).pCopy = pAVar4;
        }
      }
      for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1
          ) {
        pAVar3 = Abc_NtkObj(pNtk,local_34);
        if (((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_AigNodeIsAnd(pAVar3), iVar1 != 0)) &&
           ((pAVar3->field_5).pData != (void *)0x0)) {
          ((pAVar3->field_6).pCopy)->field_5 =
               *(anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)((long)(pAVar3->field_5).pData + 0x40);
        }
      }
      for (local_34 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
        pAVar4 = Abc_NtkCo(pNtk,local_34);
        pAVar3 = (pAVar4->field_6).pCopy;
        pAVar4 = Abc_ObjChild0Copy(pAVar4);
        Abc_ObjAddFanin(pAVar3,pAVar4);
      }
      iVar1 = Abc_NtkNodeNum(pNtk);
      iVar2 = Abc_NtkNodeNum(pNtk_local);
      if (iVar1 != iVar2) {
        iVar1 = Abc_NtkNodeNum(pNtk);
        iVar2 = Abc_NtkNodeNum(pNtk_local);
        printf("Warning: Structural hashing during duplication reduced %d nodes (this is a minor bug).\n"
               ,(ulong)(uint)(iVar1 - iVar2));
      }
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar5 = Abc_NtkDup(pNtk->pExdc);
      pNtk_local->pExdc = pAVar5;
    }
    if (pNtk->pExcare != (void *)0x0) {
      pAVar5 = Abc_NtkDup((Abc_Ntk_t *)pNtk->pExcare);
      pNtk_local->pExcare = pAVar5;
    }
    if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
      Abc_NtkTimeInitialize(pNtk_local,pNtk);
    }
    if (pNtk->vPhases != (Vec_Int_t *)0x0) {
      Abc_NtkTransferPhases(pNtk_local,pNtk);
    }
    if (pNtk->pWLoadUsed != (char *)0x0) {
      pcVar6 = Abc_UtilStrsav(pNtk->pWLoadUsed);
      pNtk_local->pWLoadUsed = pcVar6;
    }
    iVar1 = Abc_NtkCheck(pNtk_local);
    if (iVar1 == 0) {
      fprintf(_stdout,"Abc_NtkDup(): Network check has failed.\n");
    }
    pNtk->pCopy = pNtk_local;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkDup( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    if ( pNtk == NULL )
        return NULL;
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, pNtk->ntkType, pNtk->ntkFunc );
    // copy the internal nodes
    if ( Abc_NtkIsStrash(pNtk) )
    {
        // copy the AND gates
        Abc_AigForEachAnd( pNtk, pObj, i )
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
        // relink the choice nodes
        Abc_AigForEachAnd( pNtk, pObj, i )
            if ( pObj->pData )
                pObj->pCopy->pData = ((Abc_Obj_t *)pObj->pData)->pCopy;
        // relink the CO nodes
        Abc_NtkForEachCo( pNtk, pObj, i )
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjChild0Copy(pObj) );
        // get the number of nodes before and after
        if ( Abc_NtkNodeNum(pNtk) != Abc_NtkNodeNum(pNtkNew) )
            printf( "Warning: Structural hashing during duplication reduced %d nodes (this is a minor bug).\n",
                Abc_NtkNodeNum(pNtk) - Abc_NtkNodeNum(pNtkNew) );
    }
    else
    {
        // duplicate the nets and nodes (CIs/COs/latches already dupped)
        Abc_NtkForEachObj( pNtk, pObj, i )
            if ( pObj->pCopy == NULL )
                Abc_NtkDupObj(pNtkNew, pObj, Abc_NtkHasBlackbox(pNtk) && Abc_ObjIsNet(pObj));
        // reconnect all objects (no need to transfer attributes on edges)
        Abc_NtkForEachObj( pNtk, pObj, i )
            if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
                Abc_ObjForEachFanin( pObj, pFanin, k )
                    Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    }
    // duplicate the EXDC Ntk
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    if ( pNtk->pExcare )
        pNtkNew->pExcare = Abc_NtkDup( (Abc_Ntk_t *)pNtk->pExcare );
    // duplicate timing manager
    if ( pNtk->pManTime )
        Abc_NtkTimeInitialize( pNtkNew, pNtk );
    if ( pNtk->vPhases )
        Abc_NtkTransferPhases( pNtkNew, pNtk );
    if ( pNtk->pWLoadUsed )
        pNtkNew->pWLoadUsed = Abc_UtilStrsav( pNtk->pWLoadUsed );
    // check correctness
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkDup(): Network check has failed.\n" );
    pNtk->pCopy = pNtkNew;
    return pNtkNew;
}